

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator=(base_uint<256U> *this,uint64_t b)

{
  long lVar1;
  undefined8 in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->pn[0] = (uint32_t)in_RSI;
  in_RDI->pn[1] = (uint32_t)((ulong)in_RSI >> 0x20);
  for (local_1c = 2; local_1c < 8; local_1c = local_1c + 1) {
    in_RDI->pn[local_1c] = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator=(uint64_t b)
    {
        pn[0] = (unsigned int)b;
        pn[1] = (unsigned int)(b >> 32);
        for (int i = 2; i < WIDTH; i++)
            pn[i] = 0;
        return *this;
    }